

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void igTextColored(ImVec4 col,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list args;
  char *fmt_local;
  ImVec4 col_local;
  
  col_local._0_8_ = col._8_8_;
  fmt_local = col._0_8_;
  if (in_AL != '\0') {
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_e8;
  args[0]._0_8_ = &stack0x00000008;
  local_38._4_4_ = 0x50;
  local_38._0_4_ = 8;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  args[0].reg_save_area = fmt;
  ImGui::TextColoredV((ImVec4 *)&fmt_local,fmt,(__va_list_tag *)local_38);
  return;
}

Assistant:

CIMGUI_API void _igTextColored (ImVec4 const *larg1, char *larg2) {
  ImVec4 arg1 ;
  char *arg2 = (char *) 0 ;
  void *arg3 = 0 ;
  
  arg1 = *larg1;
  arg2 = larg2;
  try {
    igTextColored(arg1,(char const *)arg2,arg3);
    
  } catch (...) {
    
  }
}